

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl.h
# Opt level: O1

void a__GLTargetBind(AGLDrawTarget *target)

{
  uint uVar1;
  GLuint GVar2;
  
  if (target->framebuffer == (AGLFramebuffer *)0x0) {
    GVar2 = 0;
  }
  else {
    GVar2 = target->framebuffer->name;
  }
  if (a__gl_state.framebuffer.binding != GVar2) {
    a__gl_state.framebuffer.binding = GVar2;
    glBindFramebuffer(0x8d40);
  }
  uVar1 = (target->viewport).x;
  if ((((uVar1 == a__gl_state.viewport.x) && ((target->viewport).y == a__gl_state.viewport.y)) &&
      ((target->viewport).w == a__gl_state.viewport.w)) &&
     ((target->viewport).h == a__gl_state.viewport.h)) {
    return;
  }
  a__gl_state.viewport.y = (target->viewport).y;
  a__gl_state.viewport.w = (target->viewport).w;
  a__gl_state.viewport.h = (target->viewport).h;
  a__gl_state.viewport.x = uVar1;
  glViewport();
  return;
}

Assistant:

static void a__GLTargetBind(const AGLDrawTarget *target) {
	ATTO_GL_PROFILE_PREAMBLE
	a__GLFramebufferBind(target->framebuffer);

	if (target->viewport.x != a__gl_state.viewport.x || target->viewport.y != a__gl_state.viewport.y ||
		target->viewport.w != a__gl_state.viewport.w || target->viewport.h != a__gl_state.viewport.h) {
		a__gl_state.viewport.x = target->viewport.x;
		a__gl_state.viewport.y = target->viewport.y;
		a__gl_state.viewport.w = target->viewport.w;
		a__gl_state.viewport.h = target->viewport.h;

		AGL__CALL(glViewport(target->viewport.x, target->viewport.y, target->viewport.w, target->viewport.h));
	}
	ATTO_GL_PROFILE_FUNC(__FUNCTION__, aAppTime() - start);
}